

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O3

uchar __thiscall smf::MidiFile::readByte(MidiFile *this,istream *input)

{
  ulong in_RAX;
  uchar buffer [1];
  undefined8 uStack_18;
  
  uStack_18 = in_RAX & 0xffffffffffffff;
  std::istream::read((char *)input,(long)&uStack_18 + 7);
  if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) == 0) {
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: unexpected end of file.",0x1e);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    this->m_rwstatus = false;
    uStack_18._7_1_ = '\0';
  }
  return uStack_18._7_1_;
}

Assistant:

uchar MidiFile::readByte(std::istream& input) {
	uchar buffer[1] = {0};
	input.read((char*)buffer, 1);
	if (input.eof()) {
		std::cerr << "Error: unexpected end of file." << std::endl;
		m_rwstatus = false;
		return 0;
	}
	return buffer[0];
}